

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::Boxed_Number::const_binary_int_go<signed_char>
          (Boxed_Number *this,Opers t_oper,char *t,char *u)

{
  byte bVar1;
  int iVar2;
  arithmetic_error *this_00;
  bad_any_cast *this_01;
  Boxed_Value BVar3;
  string local_40;
  
  switch(t_oper) {
  case shift_left:
    iVar2 = (int)*t << (*u & 0x1fU);
    goto LAB_00173f63;
  case shift_right:
    iVar2 = (int)*t >> (*u & 0x1fU);
    goto LAB_00173f63;
  case remainder:
    if (*u == '\0') {
      this_00 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_40.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_40.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_40.field_2._8_6_ = 0x6f72657a2079;
      local_40._M_string_length = 0xe;
      local_40.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(this_00,&local_40);
      __cxa_throw(this_00,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error)
      ;
    }
    iVar2 = (int)(short)((short)*t % (short)*u);
    goto LAB_00173f63;
  case bitwise_and:
    bVar1 = *u & *t;
    break;
  case bitwise_or:
    bVar1 = *u | *t;
    break;
  case bitwise_xor:
    bVar1 = *u ^ *t;
    break;
  default:
    this_01 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_01);
    __cxa_throw(this_01,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  iVar2 = (int)(char)bVar1;
LAB_00173f63:
  local_40._M_dataplus._M_p._0_4_ = iVar2;
  BVar3 = detail::const_var_impl<int>((detail *)this,(int *)&local_40);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value const_binary_int_go(Operators::Opers t_oper, const T &t, const T &u) 
      {
        switch (t_oper)
        {
          case Operators::shift_left:
            return const_var(t << u);
          case Operators::shift_right:
            return const_var(t >> u);
          case Operators::remainder:
            check_divide_by_zero(u);
            return const_var(t % u);
          case Operators::bitwise_and:
            return const_var(t & u);
          case Operators::bitwise_or:
            return const_var(t | u);
          case Operators::bitwise_xor:
            return const_var(t ^ u);
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
      }